

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O0

Vec_Wec_t * Seg_ManCollectObjEdges(Vec_Int_t *vEdges,int nObjs)

{
  int iVar1;
  int Level;
  Vec_Wec_t *p;
  Vec_Wec_t *vRes;
  int i;
  int iObj;
  int iFanin;
  int nObjs_local;
  Vec_Int_t *vEdges_local;
  
  p = Vec_WecStart(nObjs);
  for (vRes._0_4_ = 0; iVar1 = Vec_IntSize(vEdges), (int)vRes + 1 < iVar1;
      vRes._0_4_ = (int)vRes + 2) {
    iVar1 = Vec_IntEntry(vEdges,(int)vRes);
    Level = Vec_IntEntry(vEdges,(int)vRes + 1);
    Vec_WecPush(p,iVar1,(int)vRes / 2);
    Vec_WecPush(p,Level,(int)vRes / 2);
  }
  return p;
}

Assistant:

Vec_Wec_t * Seg_ManCollectObjEdges( Vec_Int_t * vEdges, int nObjs )
{
    int iFanin, iObj, i;
    Vec_Wec_t * vRes = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDouble( vEdges, iFanin, iObj, i )
    {
        Vec_WecPush( vRes, iFanin, i/2 );
        Vec_WecPush( vRes, iObj, i/2 );
    }
    return vRes;
}